

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall testing::internal::anon_unknown_31::FailureTest::~FailureTest(FailureTest *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__FailureTest_00149760;
  pcVar2 = (this->error_message_)._M_dataplus._M_p;
  paVar1 = &(this->error_message_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->loc_).file._M_dataplus._M_p;
  paVar1 = &(this->loc_).file.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00148f28;
  std::
  unique_ptr<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ::~unique_ptr(&(this->super_Test).gtest_flag_saver_);
  operator_delete(this,0x60);
  return;
}

Assistant:

explicit FailureTest(const CodeLocation& loc, std::string error_message,
                       bool as_error)
      : loc_(loc),
        error_message_(std::move(error_message)),
        as_error_(as_error) {}